

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O1

void __thiscall
MockMemoryReportFormatter::report_test_start
          (MockMemoryReportFormatter *this,TestResult *result,UtestShell *test)

{
  TestMemoryAllocator *allocator;
  int iVar1;
  TestMemoryAllocator *allocator_00;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  allocator = previousNewAllocator;
  allocator_00 = getCurrentNewAllocator();
  setCurrentNewAllocator(allocator);
  SimpleString::SimpleString(&local_30,"formatter");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_40,"report_test_start");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_40);
  SimpleString::SimpleString(&local_50,"result");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x80))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_50,result);
  SimpleString::SimpleString(&local_60,"test");
  (**(code **)(*plVar3 + 0x80))(plVar3,&local_60,test);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  setCurrentNewAllocator(allocator_00);
  return;
}

Assistant:

virtual void report_test_start(TestResult* result, UtestShell& test) _override
    {
        TemporaryDefaultNewAllocator tempAlloc(previousNewAllocator);
        mock("formatter").actualCall("report_test_start").withParameter("result", result).withParameter("test", &test);
    }